

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRepresentationContext::~IfcRepresentationContext
          (IfcRepresentationContext *this)

{
  code *pcVar1;
  _func_int *p_Var2;
  long *plVar3;
  long *plVar4;
  
  p_Var2 = (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>).
           _vptr_ObjectHelper[-3];
  pcVar1 = p_Var2 + 0x10 + (long)&(this->ContextType).ptr._M_dataplus;
  *(undefined ***)(pcVar1 + -0x48) = &PTR__IfcRepresentationContext_00948a60;
  *(undefined ***)(pcVar1 + 0x18) = &PTR__IfcRepresentationContext_00948a88;
  if (*(code **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(code **)(pcVar1 + -0x10),*(long *)pcVar1 + 1);
  }
  plVar3 = *(long **)(&(this->
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>).
                       field_0x10 + (long)p_Var2);
  plVar4 = (long *)(&(this->
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>).
                     field_0x20 + (long)p_Var2);
  if (plVar3 != plVar4) {
    operator_delete(plVar3,*plVar4 + 1);
    return;
  }
  return;
}

Assistant:

IfcRepresentationContext() : Object("IfcRepresentationContext") {}